

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

bool __thiscall kj::EventLoop::turn(EventLoop *this)

{
  Event **ppEVar1;
  Event **ppEVar2;
  Event *pEVar3;
  Event *pEVar4;
  undefined8 *local_28;
  long *local_20;
  
  pEVar3 = this->head;
  if (pEVar3 != (Event *)0x0) {
    ppEVar1 = &this->head;
    ppEVar2 = &pEVar3->next;
    pEVar4 = pEVar3->next;
    *ppEVar1 = pEVar4;
    if (pEVar4 != (Event *)0x0) {
      pEVar4->prev = ppEVar1;
    }
    this->depthFirstInsertPoint = ppEVar1;
    if (this->breadthFirstInsertPoint == ppEVar2) {
      this->breadthFirstInsertPoint = ppEVar1;
    }
    if (this->tail == ppEVar2) {
      this->tail = ppEVar1;
    }
    *ppEVar2 = (Event *)0x0;
    pEVar3->prev = (Event **)0x0;
    pEVar3->firing = true;
    this->currentlyFiring = pEVar3;
    (*pEVar3->_vptr_Event[1])(&local_28,pEVar3);
    this->currentlyFiring = (Event *)0x0;
    pEVar3->firing = false;
    this->depthFirstInsertPoint = ppEVar1;
    if (local_20 != (long *)0x0) {
      (**(code **)*local_28)(local_28,(long)local_20 + *(long *)(*local_20 + -0x10));
    }
  }
  return pEVar3 != (Event *)0x0;
}

Assistant:

bool EventLoop::turn() {
  _::Event* event = head;

  if (event == nullptr) {
    // No events in the queue.
    return false;
  } else {
    head = event->next;
    if (head != nullptr) {
      head->prev = &head;
    }

    depthFirstInsertPoint = &head;
    if (breadthFirstInsertPoint == &event->next) {
      breadthFirstInsertPoint = &head;
    }
    if (tail == &event->next) {
      tail = &head;
    }

    event->next = nullptr;
    event->prev = nullptr;

    Maybe<Own<_::Event>> eventToDestroy;
    {
      event->firing = true;
      KJ_DEFER(event->firing = false);
      currentlyFiring = event;
      KJ_DEFER(currentlyFiring = nullptr);
      eventToDestroy = event->fire();
    }

    depthFirstInsertPoint = &head;
    return true;
  }
}